

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O0

void __thiscall
SortedList<MessageQueue::ListEntry>::~SortedList(SortedList<MessageQueue::ListEntry> *this)

{
  SortedList<MessageQueue::ListEntry> *this_local;
  
  while (this->head != (DListNode<MessageQueue::ListEntry> *)0x0) {
    Remove(this,this->head);
  }
  return;
}

Assistant:

~SortedList()
    {
        while (head != nullptr)
        {
            Remove(head);
        }
    }